

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setLikeOptFlag(sqlite3 *db,char *zName,u8 flagVal)

{
  FuncDef *pFVar1;
  FuncDef *pDef;
  u8 flagVal_local;
  char *zName_local;
  sqlite3 *db_local;
  
  pFVar1 = sqlite3FindFunction(db,zName,2,'\x01','\0');
  if (pFVar1 != (FuncDef *)0x0) {
    pFVar1->funcFlags = (uint)flagVal | pFVar1->funcFlags;
  }
  pFVar1 = sqlite3FindFunction(db,zName,3,'\x01','\0');
  if (pFVar1 != (FuncDef *)0x0) {
    pFVar1->funcFlags = (uint)flagVal | pFVar1->funcFlags;
  }
  return;
}

Assistant:

static void setLikeOptFlag(sqlite3 *db, const char *zName, u8 flagVal){
  FuncDef *pDef;
  pDef = sqlite3FindFunction(db, zName, 2, SQLITE_UTF8, 0);
  if( ALWAYS(pDef) ){
    pDef->funcFlags |= flagVal;
  }
  pDef = sqlite3FindFunction(db, zName, 3, SQLITE_UTF8, 0);
  if( pDef ){
    pDef->funcFlags |= flagVal;
  }
}